

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O2

void czh::utils::digit_gen(DiyFp W,DiyFp Mp,DiyFp delta,string *buffer,int *K)

{
  uint uVar1;
  byte bVar2;
  ulong rest;
  ulong delta_00;
  ulong uVar3;
  long lVar4;
  uint64_t wp_w;
  ulong uVar5;
  int iVar6;
  uint64_t ten_kappa;
  DiyFp DVar7;
  DiyFp Mp_local;
  DiyFp W_local;
  
  delta_00 = delta.f;
  Mp_local.f = Mp.f;
  W_local.f = W.f;
  Mp_local.e = Mp.e;
  W_local.e = W.e;
  bVar2 = -(char)Mp.e;
  lVar4 = 1;
  ten_kappa = 1L << (bVar2 & 0x3f);
  DVar7 = DiyFp::operator-(&Mp_local,&W_local);
  wp_w = DVar7.f;
  uVar3 = Mp_local.f >> (bVar2 & 0x3f);
  uVar5 = Mp_local.f & ten_kappa - 1;
  uVar1 = 1000000000;
  iVar6 = 9;
  do {
    if (iVar6 == -1) {
      iVar6 = 0;
      rest = uVar5;
      do {
        uVar3 = rest * 10 >> (bVar2 & 0x3f);
        if ((uVar3 & 0xffffffff) != 0 || buffer->_M_string_length != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (buffer,(char)uVar3 + '0');
        }
        delta_00 = delta_00 * 10;
        lVar4 = lVar4 * 10;
        rest = rest * 10 & ten_kappa - 1;
        iVar6 = iVar6 + -1;
      } while (delta_00 <= rest);
      *K = *K + iVar6;
      wp_w = lVar4 * wp_w;
LAB_0010eb85:
      grisu_round(buffer,delta_00,rest,ten_kappa,wp_w);
      return;
    }
    if ((uVar1 <= (uint)uVar3) || (buffer->_M_string_length != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (buffer,(char)((uVar3 & 0xffffffff) / (ulong)uVar1) + '0');
    }
    uVar3 = (uVar3 & 0xffffffff) % (ulong)uVar1;
    rest = (uVar3 << (bVar2 & 0x3f)) + uVar5;
    if (rest <= delta_00) {
      *K = *K + iVar6;
      ten_kappa = (ulong)uVar1 << (bVar2 & 0x3f);
      goto LAB_0010eb85;
    }
    uVar1 = uVar1 / 10;
    iVar6 = iVar6 + -1;
  } while( true );
}

Assistant:

void digit_gen(DiyFp W, DiyFp Mp, DiyFp delta, std::string &buffer, int &K)
  {
    uint32_t div;
    int d, kappa;
    DiyFp one{((uint64_t) 1) << -Mp.e, Mp.e};
    DiyFp wp_w = Mp - W;
    uint32_t p1 = Mp.f >> -one.e;
    uint64_t p2 = Mp.f & (one.f - 1);
    kappa = 10;
    div = TEN9;
    while (kappa > 0)
    {
      d = static_cast<int>(p1 / div);
      if (d || !buffer.empty())
        buffer += static_cast<char>(static_cast<int>('0') + d);
      p1 %= div;
      kappa--;
      uint64_t tmp = (((uint64_t) p1) << -one.e) + p2;
      if (tmp <= delta.f)
      {
        K += kappa;
        grisu_round(buffer, delta.f, tmp, ((uint64_t) div) << -one.e, wp_w.f);
        return;
      }
      div /= 10;
    }
    uint64_t unit = 1;
    while (true)
    {
      p2 *= 10;
      delta.f *= 10;
      unit *= 10;
      d = static_cast<int>(p2 >> -one.e);
      if (d || !buffer.empty())
        buffer += static_cast<char>(static_cast<int>('0') + d);
      p2 &= one.f - 1;
      kappa--;
      if (p2 < delta.f)
      {
        K += kappa;
        grisu_round(buffer, delta.f, p2, one.f, wp_w.f * unit);
        return;
      }
    }
  }